

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeSet::UnicodeSet(UnicodeSet *this,UnicodeSet *o)

{
  uint in_EAX;
  UChar32 *pUVar1;
  int iVar2;
  UErrorCode status;
  undefined8 uStack_18;
  
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_0048bcb8;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_0048bdd0;
  this->len = 0;
  iVar2 = o->len + 0x10;
  if (o->stringSpan != (UnicodeSetStringSpan *)0x0 || o->bmpSet != (BMPSet *)0x0) {
    iVar2 = o->len;
  }
  this->capacity = iVar2;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  *(undefined8 *)((long)&this->strings + 1) = 0;
  *(undefined8 *)((long)&this->stringSpan + 1) = 0;
  uStack_18 = (ulong)in_EAX;
  allocateStrings(this,(UErrorCode *)((long)&uStack_18 + 4));
  if (uStack_18._4_4_ < 1) {
    pUVar1 = (UChar32 *)uprv_malloc_63((long)this->capacity << 2);
    this->list = pUVar1;
    if (pUVar1 != (UChar32 *)0x0) {
      copyFrom(this,o,'\0');
      return;
    }
  }
  clear(this);
  this->fFlags = '\x01';
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const UnicodeSet& o) :
    UnicodeFilter(o),
    len(0), capacity(o.isFrozen() ? o.len : o.len + GROW_EXTRA), list(0),
    bmpSet(0),
    buffer(0), bufferCapacity(0),
    patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0)
{
    UErrorCode status = U_ZERO_ERROR;
    allocateStrings(status);
    if (U_FAILURE(status)) {
        setToBogus(); // If memory allocation failed, set to bogus state.
        return;
    }
    list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
    if(list!=NULL){
        *this = o;
    } else { // If memory allocation failed, set to bogus state.
        setToBogus();
        return;
    }
    _dbgct(this);
}